

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::PipelineStateVkImpl::ShaderStageInfo::ShaderStageInfo
          (ShaderStageInfo *this,ShaderVkImpl *pShader)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  initializer_list<const_Diligent::ShaderVkImpl_*> __l;
  initializer_list<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __l_00;
  allocator_type local_31;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  this->Type = (pShader->super_ShaderBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
               .m_Desc.ShaderType;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_30;
  local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pShader;
  std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>::
  vector(&this->Shaders,__l,&local_31);
  __x = ShaderVkImpl::GetSPIRV(pShader);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_30,__x);
  __l_00._M_len = 1;
  __l_00._M_array = &local_30;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&this->SPIRVs,__l_00,(allocator_type *)&local_31);
  if ((ShaderVkImpl *)
      local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (ShaderVkImpl *)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

PipelineStateVkImpl::ShaderStageInfo::ShaderStageInfo(const ShaderVkImpl* pShader) :
    Type{pShader->GetDesc().ShaderType},
    Shaders{pShader},
    SPIRVs{pShader->GetSPIRV()}
{}